

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

Node * __thiscall
TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit>::NewKey
          (TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit> *this,FModelVertex key)

{
  Node *pNVar1;
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Node *pNVar6;
  Node *pNVar7;
  Node *pNVar8;
  Node *pNVar9;
  hash_t hVar10;
  uint uVar11;
  uint uVar12;
  
  pNVar7 = this->Nodes;
  hVar10 = this->Size;
  do {
    uVar12 = SUB84((double)key.z + 6755399441055744.0,0) * 0x40000 +
             SUB84((double)key.y + 6755399441055744.0,0) * 0x200 +
             SUB84((double)key.x + 6755399441055744.0,0) & hVar10 - 1;
    pNVar1 = pNVar7 + uVar12;
    pNVar6 = pNVar7[uVar12].Next;
    if (pNVar6 == (Node *)0x1) {
LAB_004966b1:
      pNVar9 = (Node *)0x0;
      pNVar7 = pNVar1;
LAB_004966b6:
      pNVar1->Next = pNVar9;
      this->NumUsed = this->NumUsed + 1;
      (pNVar7->Pair).Key.v = key.v;
      (pNVar7->Pair).Key.x = (float)(int)key._0_8_;
      (pNVar7->Pair).Key.y = (float)(int)((ulong)key._0_8_ >> 0x20);
      (pNVar7->Pair).Key.z = (float)(int)key._8_8_;
      (pNVar7->Pair).Key.u = (float)(int)((ulong)key._8_8_ >> 0x20);
      return pNVar7;
    }
    pNVar9 = this->LastFree;
    while (pNVar8 = pNVar9, pNVar9 = pNVar8 + -1, pNVar7 < pNVar8) {
      if (pNVar9->Next == (Node *)0x1) {
        this->LastFree = pNVar9;
        uVar11 = SUB84((double)(pNVar1->Pair).Key.z + 6755399441055744.0,0) * 0x40000 +
                 SUB84((double)(pNVar1->Pair).Key.y + 6755399441055744.0,0) * 0x200 +
                 SUB84((double)(pNVar1->Pair).Key.x + 6755399441055744.0,0) & hVar10 - 1;
        if (uVar11 != uVar12) {
          pNVar7 = pNVar7 + uVar11;
          do {
            pNVar6 = pNVar7;
            pNVar7 = pNVar6->Next;
          } while (pNVar7 != pNVar1);
          pNVar6->Next = pNVar9;
          pNVar7 = pNVar1->Next;
          fVar4 = (pNVar1->Pair).Key.x;
          fVar5 = (pNVar1->Pair).Key.y;
          fVar3 = (pNVar1->Pair).Key.u;
          uVar2 = *(undefined8 *)&(pNVar1->Pair).Key.v;
          pNVar8[-1].Pair.Key.z = (pNVar1->Pair).Key.z;
          pNVar8[-1].Pair.Key.u = fVar3;
          *(undefined8 *)&pNVar8[-1].Pair.Key.v = uVar2;
          pNVar9->Next = pNVar7;
          pNVar8[-1].Pair.Key.x = fVar4;
          pNVar8[-1].Pair.Key.y = fVar5;
          goto LAB_004966b1;
        }
        pNVar9->Next = pNVar6;
        pNVar7 = pNVar9;
        goto LAB_004966b6;
      }
    }
    this->LastFree = pNVar9;
    Resize(this,hVar10 * 2);
    pNVar7 = this->Nodes;
    hVar10 = this->Size;
  } while( true );
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}